

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

basic_json_pointer<wchar_t> *
jsoncons::jsonpointer::basic_json_pointer<wchar_t>::parse(string_view_type *input,error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_RSI;
  basic_json_pointer<wchar_t> *in_RDI;
  string_type buffer;
  pointer_state state;
  string_type unescaped;
  char_type_conflict *pend;
  char_type_conflict *p;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  value_type *in_stack_ffffffffffffff48;
  error_code *in_stack_ffffffffffffff50;
  wstring local_98 [36];
  uint local_74;
  wstring local_70 [32];
  int *local_50;
  int *local_48;
  undefined4 local_40;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)0x722589);
  bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty(local_10);
  if (bVar1) {
    basic_json_pointer((basic_json_pointer<wchar_t> *)0x7225a6);
    local_40 = 1;
  }
  else {
    local_48 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data(local_10);
    in_stack_ffffffffffffff50 =
         (error_code *)std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data(local_10);
    sVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(local_10);
    local_50 = &in_stack_ffffffffffffff50->_M_value + sVar2;
    std::__cxx11::wstring::wstring(local_70);
    local_74 = 0;
    std::__cxx11::wstring::wstring(local_98);
    for (; local_48 < local_50; local_48 = local_48 + 1) {
      in_stack_ffffffffffffff48 = (value_type *)(ulong)local_74;
      switch(in_stack_ffffffffffffff48) {
      case (value_type *)0x0:
        if (*local_48 != 0x2f) {
          std::error_code::operator=(in_stack_ffffffffffffff50,success);
          basic_json_pointer((basic_json_pointer<wchar_t> *)0x7226a7);
          goto LAB_00722876;
        }
        local_74 = 2;
        break;
      case (value_type *)0x1:
        in_stack_ffffffffffffff40 = *local_48;
        if (in_stack_ffffffffffffff40 == 0x30) {
          std::__cxx11::wstring::push_back((wchar_t)local_98);
        }
        else {
          if (in_stack_ffffffffffffff40 != 0x31) {
            std::error_code::operator=(in_stack_ffffffffffffff50,success);
            basic_json_pointer((basic_json_pointer<wchar_t> *)0x7227d4);
            goto LAB_00722876;
          }
          std::__cxx11::wstring::push_back((wchar_t)local_98);
        }
        local_74 = 2;
        break;
      case (value_type *)0x2:
        goto switchD_0072266e_caseD_2;
      case (value_type *)0x3:
        local_74 = 2;
switchD_0072266e_caseD_2:
        in_stack_ffffffffffffff44 = *local_48;
        if (in_stack_ffffffffffffff44 == 0x2f) {
          std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          std::__cxx11::wstring::clear();
          local_74 = 3;
        }
        else if (in_stack_ffffffffffffff44 == 0x7e) {
          local_74 = 1;
        }
        else {
          std::__cxx11::wstring::push_back((wchar_t)local_98);
        }
      }
    }
    if (local_74 == 1) {
      std::error_code::operator=
                (in_stack_ffffffffffffff50,
                 (jsonpointer_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      basic_json_pointer((basic_json_pointer<wchar_t> *)0x722824);
    }
    else {
      if ((local_74 == 2) || (local_74 == 3)) {
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      basic_json_pointer((basic_json_pointer<wchar_t> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
    }
LAB_00722876:
    local_40 = 1;
    std::__cxx11::wstring::~wstring(local_98);
    std::__cxx11::wstring::~wstring(local_70);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)in_stack_ffffffffffffff50);
  return in_RDI;
}

Assistant:

static basic_json_pointer parse(const string_view_type& input, std::error_code& ec)
        {
            std::vector<string_type> tokens;
            if (input.empty())
            {
                return basic_json_pointer<CharT>();
            }

            const char_type* p = input.data();
            const char_type* pend = input.data() + input.size();
            string_type unescaped;

            auto state = jsonpointer::detail::pointer_state::start;
            string_type buffer;

            while (p < pend)
            {
                    switch (state)
                    {
                        case jsonpointer::detail::pointer_state::start: 
                            switch (*p)
                            {
                                case '/':
                                    state = jsonpointer::detail::pointer_state::new_token;
                                    break;
                                default:
                                    ec = jsonpointer_errc::expected_slash;
                                    return basic_json_pointer();
                            };
                            break;
                        case jsonpointer::detail::pointer_state::part:
                            state = jsonpointer::detail::pointer_state::new_token; 
                            JSONCONS_FALLTHROUGH;

                        case jsonpointer::detail::pointer_state::new_token: 
                            switch (*p)
                            {
                                case '/':
                                    tokens.push_back(buffer);
                                    buffer.clear();
                                    state = jsonpointer::detail::pointer_state::part; 
                                    break;
                                case '~':
                                    state = jsonpointer::detail::pointer_state::escaped;
                                    break;
                                default:
                                    buffer.push_back(*p);
                                    break;
                            };
                            break;
                        case jsonpointer::detail::pointer_state::escaped: 
                            switch (*p)
                            {
                                case '0':
                                    buffer.push_back('~');
                                    state = jsonpointer::detail::pointer_state::new_token;
                                    break;
                                case '1':
                                    buffer.push_back('/');
                                    state = jsonpointer::detail::pointer_state::new_token;
                                    break;
                                default:
                                    ec = jsonpointer_errc::expected_0_or_1;
                                    return basic_json_pointer();
                            };
                            break;
                    }
                    ++p;
            }
            if (state == jsonpointer::detail::pointer_state::escaped)
            {
                ec = jsonpointer_errc::expected_0_or_1;
                return basic_json_pointer();
            }
            if (state == jsonpointer::detail::pointer_state::new_token || state == jsonpointer::detail::pointer_state::part)
            {
                tokens.push_back(buffer);
            }
            return basic_json_pointer(tokens);
        }